

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void windowAggStep(Parse *pParse,Window *pMWin,int csr,int bInverse,int reg)

{
  byte bVar1;
  ExprList *pEVar2;
  FuncDef *pP4;
  int p3;
  int iVar3;
  Vdbe *p;
  CollSeq *zP4;
  int iVar4;
  int p2;
  int p1;
  int iVar5;
  Window *pWVar6;
  
  p = sqlite3GetVdbe(pParse);
  pWVar6 = pMWin;
  do {
    if (pWVar6 == (Window *)0x0) {
      return;
    }
    pEVar2 = (pWVar6->pOwner->x).pList;
    iVar4 = 0;
    if (pEVar2 != (ExprList *)0x0) {
      iVar4 = pEVar2->nExpr;
    }
    pP4 = pWVar6->pFunc;
    iVar5 = 0;
    iVar3 = 0;
    if (0 < iVar4) {
      iVar5 = 0;
      iVar3 = iVar4;
    }
    for (; iVar3 != iVar5; iVar5 = iVar5 + 1) {
      if ((iVar5 == 1) && (pP4->zName == "nth_value")) {
        p1 = pMWin->iEphCsr;
        p2 = pWVar6->iArgCol + 1;
        p3 = reg + 1;
      }
      else {
        p2 = pWVar6->iArgCol + iVar5;
        p1 = csr;
        p3 = reg + iVar5;
      }
      sqlite3VdbeAddOp3(p,0x5a,p1,p2,p3);
    }
    if (((pMWin->regStartRowid == 0) && ((pP4->funcFlags & 0x1000) != 0)) && (pWVar6->eStart != 'W')
       ) {
      iVar5 = sqlite3VdbeAddOp1(p,0x32,reg);
      if (bInverse == 0) {
        sqlite3VdbeAddOp2(p,0x53,pWVar6->regApp + 1,1);
        sqlite3VdbeAddOp2(p,0x4f,reg,pWVar6->regApp);
        sqlite3VdbeAddOp3(p,0x5c,pWVar6->regApp,2,pWVar6->regApp + 2);
        sqlite3VdbeAddOp2(p,0x84,pWVar6->csrApp,pWVar6->regApp + 2);
      }
      else {
        sqlite3VdbeAddOp4Int(p,0x18,pWVar6->csrApp,0,reg,1);
        sqlite3VdbeAddOp1(p,0x7b,pWVar6->csrApp);
        sqlite3VdbeJumpHere(p,p->nOp + -2);
      }
LAB_0017bd68:
      sqlite3VdbeJumpHere(p,iVar5);
    }
    else if (pWVar6->regApp == 0) {
      if (pP4->xSFunc != noopStepFunc) {
        if (pWVar6->pFilter == (Expr *)0x0) {
          iVar5 = 0;
        }
        else {
          iVar3 = sqlite3GetTempReg(pParse);
          sqlite3VdbeAddOp3(p,0x5a,csr,pWVar6->iArgCol + iVar4,iVar3);
          iVar5 = sqlite3VdbeAddOp3(p,0x14,iVar3,0,1);
          if (iVar3 != 0) {
            bVar1 = pParse->nTempReg;
            if ((ulong)bVar1 < 8) {
              pParse->nTempReg = bVar1 + 1;
              pParse->aTempReg[bVar1] = iVar3;
            }
          }
        }
        if ((pP4->funcFlags & 0x20) != 0) {
          zP4 = sqlite3ExprNNCollSeq(pParse,((pWVar6->pOwner->x).pList)->a[0].pExpr);
          sqlite3VdbeAddOp4(p,0x52,0,0,0,(char *)zP4,-2);
        }
        sqlite3VdbeAddOp3(p,(bInverse == 0) + 0x99,bInverse,reg,pWVar6->regAccum);
        sqlite3VdbeAppendP4(p,pP4,-8);
        if (0 < (long)p->nOp) {
          p->aOp[(long)p->nOp + -1].p5 = (ushort)iVar4 & 0xff;
        }
        if (iVar5 != 0) goto LAB_0017bd68;
      }
    }
    else {
      sqlite3VdbeAddOp2(p,0x53,(pWVar6->regApp - bInverse) + 1,1);
    }
    pWVar6 = pWVar6->pNextWin;
  } while( true );
}

Assistant:

static void windowAggStep(
  Parse *pParse, 
  Window *pMWin,                  /* Linked list of window functions */
  int csr,                        /* Read arguments from this cursor */
  int bInverse,                   /* True to invoke xInverse instead of xStep */
  int reg                         /* Array of registers */
){
  Vdbe *v = sqlite3GetVdbe(pParse);
  Window *pWin;
  for(pWin=pMWin; pWin; pWin=pWin->pNextWin){
    FuncDef *pFunc = pWin->pFunc;
    int regArg;
    int nArg = windowArgCount(pWin);
    int i;

    for(i=0; i<nArg; i++){
      if( i!=1 || pFunc->zName!=nth_valueName ){
        sqlite3VdbeAddOp3(v, OP_Column, csr, pWin->iArgCol+i, reg+i);
      }else{
        sqlite3VdbeAddOp3(v, OP_Column, pMWin->iEphCsr, pWin->iArgCol+i, reg+i);
      }
    }
    regArg = reg;

    if( pMWin->regStartRowid==0
     && (pFunc->funcFlags & SQLITE_FUNC_MINMAX) 
     && (pWin->eStart!=TK_UNBOUNDED)
    ){
      int addrIsNull = sqlite3VdbeAddOp1(v, OP_IsNull, regArg);
      VdbeCoverage(v);
      if( bInverse==0 ){
        sqlite3VdbeAddOp2(v, OP_AddImm, pWin->regApp+1, 1);
        sqlite3VdbeAddOp2(v, OP_SCopy, regArg, pWin->regApp);
        sqlite3VdbeAddOp3(v, OP_MakeRecord, pWin->regApp, 2, pWin->regApp+2);
        sqlite3VdbeAddOp2(v, OP_IdxInsert, pWin->csrApp, pWin->regApp+2);
      }else{
        sqlite3VdbeAddOp4Int(v, OP_SeekGE, pWin->csrApp, 0, regArg, 1);
        VdbeCoverageNeverTaken(v);
        sqlite3VdbeAddOp1(v, OP_Delete, pWin->csrApp);
        sqlite3VdbeJumpHere(v, sqlite3VdbeCurrentAddr(v)-2);
      }
      sqlite3VdbeJumpHere(v, addrIsNull);
    }else if( pWin->regApp ){
      assert( pFunc->zName==nth_valueName
           || pFunc->zName==first_valueName
      );
      assert( bInverse==0 || bInverse==1 );
      sqlite3VdbeAddOp2(v, OP_AddImm, pWin->regApp+1-bInverse, 1);
    }else if( pFunc->xSFunc!=noopStepFunc ){
      int addrIf = 0;
      if( pWin->pFilter ){
        int regTmp;
        assert( nArg==0 || nArg==pWin->pOwner->x.pList->nExpr );
        assert( nArg || pWin->pOwner->x.pList==0 );
        regTmp = sqlite3GetTempReg(pParse);
        sqlite3VdbeAddOp3(v, OP_Column, csr, pWin->iArgCol+nArg,regTmp);
        addrIf = sqlite3VdbeAddOp3(v, OP_IfNot, regTmp, 0, 1);
        VdbeCoverage(v);
        sqlite3ReleaseTempReg(pParse, regTmp);
      }
      if( pFunc->funcFlags & SQLITE_FUNC_NEEDCOLL ){
        CollSeq *pColl;
        assert( nArg>0 );
        pColl = sqlite3ExprNNCollSeq(pParse, pWin->pOwner->x.pList->a[0].pExpr);
        sqlite3VdbeAddOp4(v, OP_CollSeq, 0,0,0, (const char*)pColl, P4_COLLSEQ);
      }
      sqlite3VdbeAddOp3(v, bInverse? OP_AggInverse : OP_AggStep, 
                        bInverse, regArg, pWin->regAccum);
      sqlite3VdbeAppendP4(v, pFunc, P4_FUNCDEF);
      sqlite3VdbeChangeP5(v, (u8)nArg);
      if( addrIf ) sqlite3VdbeJumpHere(v, addrIf);
    }
  }
}